

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool operator==(BigNum *a,BigNum *b)

{
  bool bVar1;
  bool local_d1;
  BigNum local_b8;
  byte local_91;
  BigNum local_90;
  BigNum local_60;
  BigNum local_40;
  BigNum *local_20;
  BigNum *b_local;
  BigNum *a_local;
  
  local_20 = b;
  b_local = a;
  BigNum::BigNum(&local_40,a);
  local_91 = 0;
  BigNum::BigNum(&local_60,b);
  bVar1 = operator>(&local_40,&local_60);
  local_d1 = true;
  if (!bVar1) {
    BigNum::BigNum(&local_90,a);
    local_91 = 1;
    BigNum::BigNum(&local_b8,b);
    local_d1 = operator<(&local_90,&local_b8);
  }
  a_local._7_1_ = (local_d1 ^ 0xffU) & 1;
  if (!bVar1) {
    BigNum::~BigNum(&local_b8);
  }
  if ((local_91 & 1) != 0) {
    BigNum::~BigNum(&local_90);
  }
  BigNum::~BigNum(&local_60);
  BigNum::~BigNum(&local_40);
  return (bool)(a_local._7_1_ & 1);
}

Assistant:

bool operator ==(BigNum a, BigNum b){
    return !(a > b || a < b);
}